

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O0

void __thiscall cxxpool::thread_pool::thread_pool(thread_pool *this)

{
  thread_pool *this_local;
  
  this->done_ = false;
  this->paused_ = false;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads_);
  std::
  priority_queue<cxxpool::detail::priority_task,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>,std::less<cxxpool::detail::priority_task>>
  ::
  priority_queue<std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>,void>
            ((priority_queue<cxxpool::detail::priority_task,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>,std::less<cxxpool::detail::priority_task>>
              *)&this->tasks_);
  detail::infinite_counter<unsigned_long,_18446744073709551615UL>::infinite_counter
            (&this->task_counter_);
  std::condition_variable::condition_variable(&this->task_cond_var_);
  memset(&this->task_mutex_,0,0x28);
  std::mutex::mutex(&this->task_mutex_);
  memset(&this->thread_mutex_,0,0x28);
  std::mutex::mutex(&this->thread_mutex_);
  return;
}

Assistant:

thread_pool()
    : done_{false}, paused_{false}, threads_{}, tasks_{}, task_counter_{},
      task_cond_var_{}, task_mutex_{}, thread_mutex_{}
    {}